

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O3

_InstInfo * inst_lookup_prefixed(_InstNode in,_PrefixState *ps)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  _InstInfo *p_Var5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = ps->decodedPrefixes;
  uVar6 = uVar2 & 0x2060;
  bVar4 = true;
  bVar3 = true;
  if (uVar6 < 0x40) {
    if (uVar6 == 0) goto LAB_0010493b;
    if (uVar6 == 0x20) {
      uVar7 = 0xffffffdf;
      uVar6 = 3;
    }
    else {
LAB_00104907:
      if ((~uVar2 & 0x60) == 0) {
        return (_InstInfo *)0x0;
      }
      if ((uVar2 & 0x20) == 0) {
        uVar7 = 0xffffff9f;
        bVar3 = false;
        uVar6 = 2;
        bVar4 = false;
        if ((uVar2 & 0x40) == 0) {
          uVar6 = 0;
          goto LAB_0010493b;
        }
      }
      else {
        uVar7 = 0xffffffdf;
        uVar6 = 3;
        bVar4 = false;
      }
    }
  }
  else if (uVar6 == 0x40) {
    uVar7 = 0xffffffbf;
    uVar6 = 2;
  }
  else {
    if (uVar6 != 0x2000) goto LAB_00104907;
    ps->isOpSizeMandatory = 1;
    uVar7 = 0xffffdfff;
    uVar6 = 1;
  }
  bVar3 = bVar4;
  ps->decodedPrefixes = uVar2 & uVar7;
LAB_0010493b:
  uVar1 = InstructionsTree[uVar6 + (in & 0x1fff)];
  if (uVar1 == 0) {
    if (bVar3) {
      uVar1 = InstructionsTree[in & 0x1fff];
      if (uVar1 != 0) {
        p_Var5 = (_InstInfo *)
                 ((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar1 & 0x1fff) * 0xc));
        if ((uVar1 & 0xe000) == 0x2000) {
          p_Var5 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar1 & 0x1fff) * 4));
        }
        return p_Var5;
      }
    }
    return (_InstInfo *)0x0;
  }
  p_Var5 = (_InstInfo *)((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar1 & 0x1fff) * 0xc));
  if ((uVar1 & 0xe000) == 0x2000) {
    p_Var5 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar1 & 0x1fff) * 4));
  }
  if (!bVar3) {
    if ((*(byte *)((long)FlagsTable +
                  (ulong)InstSharedInfoTable[p_Var5->sharedIndex].flagsIndex * 4 + 1) & 0x20) == 0)
    {
      p_Var5 = (_InstInfo *)0x0;
    }
    return p_Var5;
  }
  return p_Var5;
}

Assistant:

static _InstInfo* inst_lookup_prefixed(_InstNode in, _PrefixState* ps)
{
	int checkOpSize = FALSE;
	int index = 0;
	_InstInfo* ii = NULL;

	/* Check prefixes of current decoded instruction (None, 0x66, 0xf3, 0xf2). */
	switch (ps->decodedPrefixes & (INST_PRE_OP_SIZE | INST_PRE_REPS))
	{
		case 0:
			/* Non-prefixed, index = 0. */
			index = 0;
		break;
		case INST_PRE_OP_SIZE:
			/* 0x66, index = 1. */
			index = 1;
			/* Mark that we used it as a mandatory prefix. */
			ps->isOpSizeMandatory = TRUE;
			ps->decodedPrefixes &= ~INST_PRE_OP_SIZE;
		break;
		case INST_PRE_REP:
			/* 0xf3, index = 2. */
			index = 2;
			ps->decodedPrefixes &= ~INST_PRE_REP;
		break;
		case INST_PRE_REPNZ:
			/* 0xf2, index = 3. */
			index = 3;
			ps->decodedPrefixes &= ~INST_PRE_REPNZ;
		break;
		default:
			/*
			 * Now we got a problem, since there are a few mandatory prefixes at once.
			 * There is only one case when it's ok, when the operand size prefix is for real (not mandatory).
			 * Otherwise we will have to return NULL, since the instruction is illegal.
			 * Therefore we will start with REPNZ and REP prefixes,
			 * try to get the instruction and only then check for the operand size prefix.
			 */

			 /* If both REPNZ and REP are together, it's illegal for sure. */
			if ((ps->decodedPrefixes & INST_PRE_REPS) == INST_PRE_REPS) return NULL;

			/* Now we know it's either REPNZ+OPSIZE or REP+OPSIZE, so examine the instruction. */
			if (ps->decodedPrefixes & INST_PRE_REPNZ) {
				index = 3;
				ps->decodedPrefixes &= ~INST_PRE_REPNZ;
			}
			else if (ps->decodedPrefixes & INST_PRE_REP) {
				index = 2;
				ps->decodedPrefixes &= ~INST_PRE_REP;
			}
			/* Mark to verify the operand-size prefix of the fetched instruction below. */
			checkOpSize = TRUE;
		break;
	}

	/* Fetch the inst-info from the index. */
	ii = inst_get_info(in, index);

	if (checkOpSize) {
		/* If the instruction doesn't support operand size prefix, then it's illegal. */
		if ((ii == NULL) || (~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE)) return NULL;
	}

	/* If there was a prefix, but the instruction wasn't found. Try to fall back to use the normal instruction. */
	if (ii == NULL) ii = inst_get_info(in, 0);
	return ii;
}